

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O3

void FStateDefinitions::MakeStateList(FStateLabels *list,TArray<FStateDefine,_FStateDefine> *dest)

{
  long lVar1;
  FStateLabels **ppFVar2;
  FStateDefine local_58;
  
  if (dest->Count != 0) {
    TArray<FStateDefine,_FStateDefine>::DoDelete(dest,0,dest->Count - 1);
    dest->Count = 0;
  }
  if ((list != (FStateLabels *)0x0) && (0 < list->NumLabels)) {
    ppFVar2 = &list->Labels[0].Children;
    lVar1 = 0;
    do {
      local_58.Children.Array = (FStateDefine *)0x0;
      local_58.Children.Most = 0;
      local_58.Children.Count = 0;
      local_58.Label.Index = (((FStateLabel *)(ppFVar2 + -2))->Label).Index;
      local_58.State = (FState *)ppFVar2[-1];
      local_58.DefineFlags = '\x01';
      TArray<FStateDefine,_FStateDefine>::Push(dest,&local_58);
      if (*ppFVar2 != (FStateLabels *)0x0) {
        MakeStateList(*ppFVar2,&dest->Array[dest->Count - 1].Children);
      }
      TArray<FStateDefine,_FStateDefine>::~TArray(&local_58.Children);
      lVar1 = lVar1 + 1;
      ppFVar2 = ppFVar2 + 3;
    } while (lVar1 < list->NumLabels);
  }
  return;
}

Assistant:

void FStateDefinitions::MakeStateList(const FStateLabels *list, TArray<FStateDefine> &dest)
{
	dest.Clear();
	if (list != NULL) for (int i = 0; i < list->NumLabels; i++)
	{
		FStateDefine def;

		def.Label = list->Labels[i].Label;
		def.State = list->Labels[i].State;
		def.DefineFlags = SDF_STATE;
		dest.Push(def);
		if (list->Labels[i].Children != NULL)
		{
			MakeStateList(list->Labels[i].Children, dest[dest.Size()-1].Children);
		}
	}
}